

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  MessageSCCAnalyzer *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  reference ppFVar5;
  value_type desc;
  value_type this_01;
  Descriptor *descriptor;
  string *psVar6;
  FieldGenerator *pFVar7;
  Iterator IVar8;
  Iterator IVar9;
  string local_170;
  string local_150;
  value_type local_130;
  value_type field_2;
  Iterator __end4_1;
  Iterator __begin4_1;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range4_1;
  value_type field_1;
  Iterator __end4;
  Iterator __begin4;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range4;
  bool has_required_fields;
  value_type oneof;
  Iterator __end3_1;
  Iterator __begin3_1;
  OneOfRangeImpl *__range3_1;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar1) {
    Formatter::Formatter
              ((Formatter *)local_50,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &this->variables_);
    Formatter::operator()<>((Formatter *)local_50,"bool $classname$::IsInitialized() const {\n");
    Formatter::Indent((Formatter *)local_50);
    iVar3 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar3) {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "if (!_extensions_.IsInitialized()) {\n  return false;\n}\n\n");
    }
    if (0 < this->num_required_fields_) {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "if (_Internal::MissingRequiredFields(_has_bits_)) return false;\n");
    }
    __end3 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(&this->optimized_order_);
    field = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end(&this->optimized_order_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                       *)&field), bVar1) {
      ppFVar5 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end3);
      pFVar7 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar5);
      (*pFVar7->_vptr_FieldGenerator[0x15])
                (pFVar7,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>
                ((Formatter *)local_50,"if (!_weak_field_map_.IsInitialized()) return false;\n");
    }
    __begin3_1.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar8 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3_1.descriptor);
    __begin3_1._0_8_ = IVar8.descriptor;
    __end3_1.descriptor._0_4_ = IVar8.idx;
    IVar8 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3_1.descriptor);
    __end3_1._0_8_ = IVar8.descriptor;
    oneof._0_4_ = IVar8.idx;
    while (bVar1 = cpp::operator!=((Iterator *)&__end3_1.descriptor,(Iterator *)&oneof), bVar1) {
      desc = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3_1.descriptor);
      bVar1 = false;
      __begin4.descriptor = (OneofDescriptor *)FieldRange<google::protobuf::OneofDescriptor>(desc);
      IVar9 = FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                        ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
      __begin4._0_8_ = IVar9.descriptor;
      __end4.descriptor._0_4_ = IVar9.idx;
      IVar9 = FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                        ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
      __end4._0_8_ = IVar9.descriptor;
      field_1._0_4_ = IVar9.idx;
      while (bVar2 = cpp::operator!=((Iterator *)&__end4.descriptor,(Iterator *)&field_1), bVar2) {
        this_01 = FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator*
                            ((Iterator *)&__end4.descriptor);
        CVar4 = FieldDescriptor::cpp_type(this_01);
        if ((CVar4 == CPPTYPE_MESSAGE) &&
           (bVar2 = ShouldIgnoreRequiredFieldCheck(this_01,&this->options_), !bVar2)) {
          this_00 = this->scc_analyzer_;
          descriptor = FieldDescriptor::message_type(this_01);
          bVar2 = MessageSCCAnalyzer::HasRequiredFields(this_00,descriptor);
          if (bVar2) {
            bVar1 = true;
            break;
          }
        }
        FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator++
                  ((Iterator *)&__end4.descriptor);
      }
      if (bVar1) {
        psVar6 = OneofDescriptor::name_abi_cxx11_(desc);
        Formatter::operator()((Formatter *)local_50,"switch ($1$_case()) {\n",psVar6);
        Formatter::Indent((Formatter *)local_50);
        __begin4_1.descriptor =
             (OneofDescriptor *)FieldRange<google::protobuf::OneofDescriptor>(desc);
        IVar9 = FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                          ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)
                           &__begin4_1.descriptor);
        __begin4_1._0_8_ = IVar9.descriptor;
        __end4_1.descriptor._0_4_ = IVar9.idx;
        IVar9 = FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                          ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)
                           &__begin4_1.descriptor);
        __end4_1._0_8_ = IVar9.descriptor;
        field_2._0_4_ = IVar9.idx;
        while (bVar1 = cpp::operator!=((Iterator *)&__end4_1.descriptor,(Iterator *)&field_2), bVar1
              ) {
          local_130 = FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator*
                                ((Iterator *)&__end4_1.descriptor);
          psVar6 = FieldDescriptor::name_abi_cxx11_(local_130);
          UnderscoresToCamelCase(&local_150,psVar6,true);
          Formatter::operator()((Formatter *)local_50,"case k$1$: {\n",&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          Formatter::Indent((Formatter *)local_50);
          bVar1 = IsFieldStripped(local_130,&this->options_);
          if (!bVar1) {
            pFVar7 = FieldGeneratorMap::get(&this->field_generators_,local_130);
            (*pFVar7->_vptr_FieldGenerator[0x15])
                      (pFVar7,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          Formatter::operator()<>((Formatter *)local_50,"break;\n");
          Formatter::Outdent((Formatter *)local_50);
          Formatter::operator()<>((Formatter *)local_50,"}\n");
          FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator++
                    ((Iterator *)&__end4_1.descriptor);
        }
        psVar6 = OneofDescriptor::name_abi_cxx11_(desc);
        ToUpper(&local_170,psVar6);
        Formatter::operator()((Formatter *)local_50,"case $1$_NOT_SET: {\n  break;\n}\n",&local_170)
        ;
        std::__cxx11::string::~string((string *)&local_170);
        Formatter::Outdent((Formatter *)local_50);
        Formatter::operator()<>((Formatter *)local_50,"}\n");
      }
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3_1.descriptor);
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"  return true;\n}\n");
    Formatter::~Formatter((Formatter *)local_50);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateIsInitialized(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);
  format("bool $classname$::IsInitialized() const {\n");
  format.Indent();

  if (descriptor_->extension_range_count() > 0) {
    format(
        "if (!_extensions_.IsInitialized()) {\n"
        "  return false;\n"
        "}\n\n");
  }

  if (num_required_fields_ > 0) {
    format(
        "if (_Internal::MissingRequiredFields(_has_bits_))"
        " return false;\n");
  }

  // Now check that all non-oneof embedded messages are initialized.
  for (auto field : optimized_order_) {
    field_generators_.get(field).GenerateIsInitialized(printer);
  }
  if (num_weak_fields_) {
    // For Weak fields.
    format("if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  // Go through the oneof fields, emitting a switch if any might have required
  // fields.
  for (auto oneof : OneOfRange(descriptor_)) {
    bool has_required_fields = false;
    for (auto field : FieldRange(oneof)) {
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        has_required_fields = true;
        break;
      }
    }

    if (!has_required_fields) {
      continue;
    }

    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateIsInitialized(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  format.Outdent();
  format(
      "  return true;\n"
      "}\n");
}